

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O0

uint64_t highwayhash::(anonymous_namespace)::RunHighwayCat<2u>(void *param_1,size_t size)

{
  ulong in_RSI;
  HHResult64 result;
  size_t half_size;
  char in [1024];
  HighwayHashCatT<2U> cat;
  uint64_t local_550;
  ulong local_548;
  char local_540 [1024];
  HighwayHashCatT<2U> local_140;
  ulong local_60;
  
  local_60 = in_RSI;
  HighwayHashCatT<2U>::HighwayHashCatT(&local_140,&anon_unknown_0::RunHighwayCat<2U>::key);
  local_540[0] = (char)local_60;
  local_548 = local_60 >> 1;
  HighwayHashCatT<2U>::Append(&local_140,local_540,local_548);
  HighwayHashCatT<2U>::Append(&local_140,local_540 + local_548,local_60 - local_548);
  HighwayHashCatT<2U>::Finalize<unsigned_long>(&local_140,&local_550);
  return local_550;
}

Assistant:

uint64_t RunHighwayCat(const void*, const size_t size) {
  HH_ALIGNAS(32) static const HHKey key = {0, 1, 2, 3};
  HH_ALIGNAS(64) HighwayHashCatT<Target> cat(key);
  char in[kMaxBenchmarkInputSize];
  in[0] = static_cast<char>(size & 0xFF);
  const size_t half_size = size / 2;
  cat.Append(in, half_size);
  cat.Append(in + half_size, size - half_size);
  HHResult64 result;
  cat.Finalize(&result);
  return result;
}